

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpDocumentHead(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  _xmlNs *ns;
  
  if (doc != (xmlDocPtr)0x0) {
    xmlCtxtDumpDocHead(ctxt,doc);
    if (ctxt->check == 0) {
      if (doc->name != (char *)0x0) {
        fwrite("name=",5,1,(FILE *)ctxt->output);
        xmlCtxtDumpString(ctxt,(xmlChar *)doc->name);
        fputc(10,(FILE *)ctxt->output);
      }
      if (doc->version != (xmlChar *)0x0) {
        fwrite("version=",8,1,(FILE *)ctxt->output);
        xmlCtxtDumpString(ctxt,doc->version);
        fputc(10,(FILE *)ctxt->output);
      }
      if (doc->encoding != (xmlChar *)0x0) {
        fwrite("encoding=",9,1,(FILE *)ctxt->output);
        xmlCtxtDumpString(ctxt,doc->encoding);
        fputc(10,(FILE *)ctxt->output);
      }
      if (doc->URL != (xmlChar *)0x0) {
        fwrite("URL=",4,1,(FILE *)ctxt->output);
        xmlCtxtDumpString(ctxt,doc->URL);
        fputc(10,(FILE *)ctxt->output);
      }
      if (doc->standalone != 0) {
        fwrite("standalone=true\n",0x10,1,(FILE *)ctxt->output);
      }
    }
    for (ns = doc->oldNs; ns != (xmlNsPtr)0x0; ns = ns->next) {
      xmlCtxtDumpNamespace(ctxt,ns);
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpDocumentHead(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) return;
    xmlCtxtDumpDocHead(ctxt, doc);
    if (!ctxt->check) {
        if (doc->name != NULL) {
            fprintf(ctxt->output, "name=");
            xmlCtxtDumpString(ctxt, BAD_CAST doc->name);
            fprintf(ctxt->output, "\n");
        }
        if (doc->version != NULL) {
            fprintf(ctxt->output, "version=");
            xmlCtxtDumpString(ctxt, doc->version);
            fprintf(ctxt->output, "\n");
        }
        if (doc->encoding != NULL) {
            fprintf(ctxt->output, "encoding=");
            xmlCtxtDumpString(ctxt, doc->encoding);
            fprintf(ctxt->output, "\n");
        }
        if (doc->URL != NULL) {
            fprintf(ctxt->output, "URL=");
            xmlCtxtDumpString(ctxt, doc->URL);
            fprintf(ctxt->output, "\n");
        }
        if (doc->standalone)
            fprintf(ctxt->output, "standalone=true\n");
    }
    if (doc->oldNs != NULL)
        xmlCtxtDumpNamespaceList(ctxt, doc->oldNs);
}